

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::HandleRefSchema(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  *this,PointerType *source,SchemaType **schema,ValueType *v,ValueType *document,
                 UriType *id)

{
  IRemoteSchemaDocumentProviderType *pIVar1;
  Ch *pCVar2;
  bool bVar3;
  SizeType SVar4;
  ConstMemberIterator CVar5;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  **ppGVar6;
  ValueType *pVVar7;
  size_t sVar8;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *v_00;
  SchemaType *schema_00;
  ulong uVar9;
  size_t len;
  uint uVar10;
  SchemaErrorCode code;
  ulong uVar11;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *pGVar12;
  char *pcVar13;
  CrtAllocator *pCVar14;
  bool bVar15;
  PointerType pointer_2;
  PointerType relPointer;
  UriType ref;
  PointerType pointer;
  UriType scopeId;
  size_t unresolvedTokenIndex;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_248;
  UriType *local_1f8;
  undefined1 local_1f0 [64];
  CrtAllocator *local_1b0;
  char *local_188;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_170;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_138;
  size_t local_f0;
  PointerType local_e8;
  Stack<rapidjson::CrtAllocator> local_a8;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_78;
  
  internal::
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  ::GetRefString();
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_138,v);
  pCVar2 = local_138.uri_;
  CVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd(v);
  if ((Pointer)pCVar2 == CVar5.ptr_) goto LAB_00126cd3;
  local_a8.stack_ = (char *)0x0;
  local_a8.stackTop_ = (char *)0x0;
  local_a8.allocator_ = (CrtAllocator *)0x0;
  local_a8.ownAllocator_ = (CrtAllocator *)0x0;
  local_a8.stackEnd_ = (char *)0x0;
  local_a8.initialCapacity_ = 0x100;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
  ::Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
            ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
              *)source,
             (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_a8);
  ppGVar6 = internal::Stack<rapidjson::CrtAllocator>::
            Push<rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>const*>
                      (&this->schemaRef_,1);
  *ppGVar6 = source;
  if ((undefined1  [16])
      ((undefined1  [16])
       ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         *)((long)pCVar2 + 0x10))->data_ & (undefined1  [16])0x400000000000000) ==
      (undefined1  [16])0x0) {
LAB_00126ca9:
    if (schema != (SchemaType **)0x0) {
      *schema = this->typeless_;
    }
    AddSchemaRefs(this,this->typeless_);
  }
  else {
    SVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)((long)pCVar2 + 0x10));
    if (SVar4 == 0) {
      SchemaError(this,kSchemaErrorRefInvalid,source);
      goto LAB_00126ca9;
    }
    local_138.allocator_ = this->allocator_;
    local_138.frag_ = (Ch *)0x0;
    local_138.path_ = (Ch *)0x0;
    local_138.query_ = (Ch *)0x0;
    local_138.scheme_ = (Ch *)0x0;
    local_138.auth_ = (Ch *)0x0;
    local_138.uri_ = (Ch *)0x0;
    local_138.base_ = (Ch *)0x0;
    local_138.ownAllocator_ = (CrtAllocator *)0x0;
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::operator=(&local_138,id);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
    ::
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              ((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                *)&local_248,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((long)pCVar2 + 0x10),this->allocator_);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::Resolve((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *)(local_1f0 + 0x38),&local_248,&local_138,this->allocator_);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericUri(&local_248);
    local_1f8 = &this->docId_;
    local_e8.parseErrorCode_ = kPointerParseErrorNone;
    local_e8.tokenCount_ = 0;
    local_e8.parseErrorOffset_ = 0;
    local_e8.nameBuffer_ = (Ch *)0x0;
    local_e8.tokens_ = (Token *)0x0;
    local_e8.allocator_ = (CrtAllocator *)0x0;
    local_e8.ownAllocator_ = (CrtAllocator *)0x0;
    local_248.frag_._0_4_ = 0;
    local_248.path_._0_4_ = 0;
    local_248.path_._4_4_ = 0;
    local_248.query_._0_4_ = 0;
    local_248.query_._4_4_ = 0;
    local_248.scheme_ = (Ch *)0x0;
    local_248.auth_ = (Ch *)0x0;
    local_248.uri_ = (Ch *)0x0;
    local_248.base_ = (Ch *)0x0;
    pVVar7 = FindId(this,document,(UriType *)(local_1f0 + 0x38),&local_e8,local_1f8,false,
                    (PointerType *)&local_248);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)&local_248);
    if (pVVar7 == (ValueType *)0x0) {
      pIVar1 = this->remoteProvider_;
      if (pIVar1 == (IRemoteSchemaDocumentProviderType *)0x0) {
        SchemaError(this,kSchemaErrorRefNoRemoteProvider,source);
      }
      else {
        local_78.frag_ = (Ch *)0x0;
        local_78.allocator_ = (CrtAllocator *)0x0;
        local_78.path_ = (Ch *)0x0;
        local_78.query_ = (Ch *)0x0;
        local_78.scheme_ = (Ch *)0x0;
        local_78.auth_ = (Ch *)0x0;
        local_78.uri_ = (Ch *)0x0;
        local_78.base_ = (Ch *)0x0;
        local_78.ownAllocator_ = (CrtAllocator *)0x0;
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::operator=(&local_78,
                    (GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                     *)(local_1f0 + 0x38));
        this_00 = (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *)(**(code **)(*(long *)pIVar1 + 0x18))(pIVar1,&local_78,&this->spec_);
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::~GenericUri(&local_78);
        if (this_00 !=
            (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
             *)0x0) {
          if (local_188 == (char *)0x0) {
            uVar10 = 0;
          }
          else {
            sVar8 = strlen(local_188);
            uVar10 = (uint)sVar8;
          }
          if ((1 < uVar10) && (local_188[1] != '/')) {
            SchemaErrorValue(this,kSchemaErrorRefPlainName,source,local_188,uVar10);
            goto LAB_00126c82;
          }
          local_248.uri_ = (Ch *)this->allocator_;
          local_248.base_ = (Ch *)0x0;
          local_248.scheme_ = (Ch *)0x0;
          local_248.auth_ = (Ch *)0x0;
          local_248.path_._0_4_ = 0;
          local_248.path_._4_4_ = 0;
          local_248.query_._0_4_ = 0;
          local_248.query_._4_4_ = 0;
          local_248.frag_._0_4_ = 0;
          GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::Parse((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *)&local_248,local_188,(ulong)uVar10);
          if ((int)local_248.frag_ == 0) {
            schema_00 = GetSchema(this_00,(PointerType *)&local_248);
            if (schema_00 == (SchemaType *)0x0) {
              if ((CrtAllocator *)local_1f0._56_8_ == (CrtAllocator *)0x0) {
                SVar4 = 0;
              }
              else {
                sVar8 = strlen((char *)local_1f0._56_8_);
                SVar4 = (SizeType)sVar8;
              }
              SchemaErrorValue(this,kSchemaErrorRefUnknown,source,(Ch *)local_1f0._56_8_,SVar4);
            }
            else {
              if (schema != (SchemaType **)0x0) {
                *schema = schema_00;
              }
              AddSchemaRefs(this,schema_00);
            }
            if (schema_00 != (SchemaType *)0x0) {
              pGVar12 = &local_248;
              goto LAB_00126d29;
            }
          }
          else {
            SchemaErrorPointer(this,kSchemaErrorRefPointerInvalid,source,local_188,uVar10,
                               (PointerType *)&local_248);
          }
          pGVar12 = &local_248;
          goto LAB_00126c7d;
        }
        if ((CrtAllocator *)local_1f0._56_8_ == (CrtAllocator *)0x0) {
          SVar4 = 0;
        }
        else {
          sVar8 = strlen((char *)local_1f0._56_8_);
          SVar4 = (SizeType)sVar8;
        }
        SchemaErrorValue(this,kSchemaErrorRefNoRemoteSchema,source,(Ch *)local_1f0._56_8_,SVar4);
      }
LAB_00126c82:
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericPointer(&local_e8);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                     *)(local_1f0 + 0x38));
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri(&local_138);
      goto LAB_00126ca9;
    }
    if (local_188 == (char *)0x0) {
      uVar10 = 0;
    }
    else {
      sVar8 = strlen(local_188);
      uVar10 = (uint)sVar8;
    }
    if ((1 < uVar10) && (local_188[1] != '/')) {
      pCVar14 = this->allocator_;
      local_1f0._8_8_ = (CrtAllocator *)0x0;
      local_1f0._16_8_ = (Ch *)0x0;
      local_1f0._24_8_ = (Token *)0x0;
      local_1f0._32_4_ = 0;
      local_1f0._36_4_ = 0;
      local_1f0._40_4_ = 0;
      local_1f0._44_8_ = 0;
      local_1f0._0_8_ = pCVar14;
      if (((this->spec_).oapi & 0xfffffffe) == kVersion20) {
        SchemaErrorValue(this,kSchemaErrorRefPlainName,source,local_188,uVar10);
      }
      else {
        if (local_1b0 == (CrtAllocator *)0x0) {
          len = 0;
        }
        else {
          sVar8 = strlen((char *)local_1b0);
          len = sVar8 & 0xffffffff;
        }
        local_248.path_._0_4_ = 0;
        local_248.path_._4_4_ = 0;
        local_248.query_._0_4_ = 0;
        local_248.query_._4_4_ = 0;
        local_248.scheme_ = (Ch *)0x0;
        local_248.auth_ = (Ch *)0x0;
        local_248.uri_ = (Ch *)0x0;
        local_248.base_ = (Ch *)0x0;
        local_248.frag_._0_4_ = 0;
        local_248.frag_._4_4_ = 0;
        local_248.ownAllocator_ = (CrtAllocator *)0x0;
        local_248.allocator_ = pCVar14;
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::Parse(&local_248,(Ch *)local_1b0,len);
        pVVar7 = FindId(this,pVVar7,(UriType *)(local_1f0 + 0x38),(PointerType *)local_1f0,
                        &local_248,true,&local_e8);
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::~GenericUri(&local_248);
        if (pVVar7 == (ValueType *)0x0) {
          code = kSchemaErrorRefUnknown;
          pCVar14 = (CrtAllocator *)local_1f0._56_8_;
        }
        else {
          bVar15 = IsCyclicRef(this,(PointerType *)local_1f0);
          if (!bVar15) {
            GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::GetUri(&local_248,
                     (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                      *)local_1f0,document,local_1f8,(size_t *)&local_170,this->allocator_);
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::operator=(&local_138,&local_248);
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::~GenericUri(&local_248);
            CreateSchema(this,schema,(PointerType *)local_1f0,pVVar7,document,&local_138);
            goto LAB_00126c53;
          }
          code = kSchemaErrorRefCyclical;
          pCVar14 = (CrtAllocator *)local_1f0._56_8_;
        }
        if (pCVar14 == (CrtAllocator *)0x0) {
          SVar4 = 0;
        }
        else {
          sVar8 = strlen((char *)pCVar14);
          SVar4 = (SizeType)sVar8;
        }
        SchemaErrorValue(this,code,source,(Ch *)pCVar14,SVar4);
      }
LAB_00126c75:
      pGVar12 = (GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                 *)local_1f0;
LAB_00126c7d:
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                         *)pGVar12);
      goto LAB_00126c82;
    }
    local_1f0._0_8_ = this->allocator_;
    local_1f0._8_8_ = (CrtAllocator *)0x0;
    local_1f0._16_8_ = (Ch *)0x0;
    local_1f0._24_8_ = (Token *)0x0;
    local_1f0._32_4_ = 0;
    local_1f0._36_4_ = 0;
    local_1f0._40_4_ = 0;
    local_1f0._44_8_ = 0;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::Parse((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
             *)local_1f0,local_188,(ulong)uVar10);
    if (local_1f0._48_4_ != kPointerParseErrorNone) {
      SchemaErrorPointer(this,kSchemaErrorRefPointerInvalid,source,local_188,uVar10,
                         (PointerType *)local_1f0);
      goto LAB_00126c75;
    }
    v_00 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           ::Get((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  *)local_1f0,pVVar7,(size_t *)0x0);
    if (v_00 == (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)0x0) {
      if ((CrtAllocator *)local_1f0._56_8_ == (CrtAllocator *)0x0) {
        SVar4 = 0;
      }
      else {
        sVar8 = strlen((char *)local_1f0._56_8_);
        SVar4 = (SizeType)sVar8;
      }
      SchemaErrorValue(this,kSchemaErrorRefUnknown,source,(Ch *)local_1f0._56_8_,SVar4);
      goto LAB_00126c75;
    }
    local_170.allocator_ = this->allocator_;
    local_170.ownAllocator_ = (CrtAllocator *)0x0;
    local_170.nameBuffer_ = (Ch *)0x0;
    local_170.tokens_ = (Token *)0x0;
    local_170.tokenCount_._0_4_ = 0;
    local_170.tokenCount_._4_4_ = 0;
    local_170.parseErrorOffset_._0_4_ = 0;
    local_170._44_8_ = 0;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::operator=(&local_170,&local_e8);
    if (CONCAT44(local_1f0._36_4_,local_1f0._32_4_) != 0) {
      uVar9 = 0;
      uVar11 = 1;
      do {
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::Append((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  *)&local_248,&local_170,(Token *)(local_1f0._24_8_ + uVar9 * 0x10),
                 this->allocator_);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::operator=(&local_170,
                    (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                     *)&local_248);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                           *)&local_248);
        bVar15 = uVar11 < CONCAT44(local_1f0._36_4_,local_1f0._32_4_);
        uVar9 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar15);
    }
    pcVar13 = (this->schemaRef_).stack_;
    bVar15 = pcVar13 != (this->schemaRef_).stackTop_;
    if (bVar15) {
      bVar3 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              ::operator==(&local_170,
                           *(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                             **)pcVar13);
      if (!bVar3) {
        do {
          pcVar13 = pcVar13 + 8;
          bVar3 = pcVar13 == (this->schemaRef_).stackTop_;
          bVar15 = !bVar3;
          if (bVar3) break;
          bVar3 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  ::operator==(&local_170,
                               *(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                                 **)pcVar13);
        } while (!bVar3);
      }
    }
    if (bVar15) {
      if ((CrtAllocator *)local_1f0._56_8_ == (CrtAllocator *)0x0) {
        SVar4 = 0;
      }
      else {
        sVar8 = strlen((char *)local_1f0._56_8_);
        SVar4 = (SizeType)sVar8;
      }
      SchemaErrorValue(this,kSchemaErrorRefCyclical,source,(Ch *)local_1f0._56_8_,SVar4);
    }
    else {
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::GetUri(&local_248,&local_170,document,local_1f8,&local_f0,this->allocator_);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::operator=(&local_138,&local_248);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri(&local_248);
      CreateSchema(this,schema,&local_170,v_00,document,&local_138);
    }
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&local_170);
    if (bVar15) goto LAB_00126c75;
LAB_00126c53:
    pGVar12 = (GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *)local_1f0;
LAB_00126d29:
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)pGVar12);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&local_e8);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericUri((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *)(local_1f0 + 0x38));
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericUri(&local_138);
  }
  internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_a8);
LAB_00126cd3:
  return (Pointer)pCVar2 != CVar5.ptr_;
}

Assistant:

bool HandleRefSchema(const PointerType& source, const SchemaType** schema, const ValueType& v, const ValueType& document, const UriType& id) {
        typename ValueType::ConstMemberIterator itr = v.FindMember(SchemaType::GetRefString());
        if (itr == v.MemberEnd())
            return false;

        GenericStringBuffer<EncodingType> sb;
        source.StringifyUriFragment(sb);
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaDocument::HandleRefSchema", sb.GetString(), id.GetString());
        // Resolve the source pointer to the $ref'ed schema (finally)
        new (schemaRef_.template Push<SchemaRefPtr>()) SchemaRefPtr(&source);

        if (itr->value.IsString()) {
            SizeType len = itr->value.GetStringLength();
            if (len == 0)
                SchemaError(kSchemaErrorRefInvalid, source);
            else {
                // First resolve $ref against the in-scope id
                UriType scopeId = UriType(id, allocator_);
                UriType ref = UriType(itr->value, allocator_).Resolve(scopeId, allocator_);
                RAPIDJSON_SCHEMA_PRINT(SchemaIds, id.GetString(), itr->value.GetString(), ref.GetString());
                // See if the resolved $ref minus the fragment matches a resolved id in this document
                // Search from the root. Returns the subschema in the document and its absolute JSON pointer.
                PointerType basePointer = PointerType();
                const ValueType *base = FindId(document, ref, basePointer, docId_, false);
                if (!base) {
                    // Remote reference - call the remote document provider
                    if (!remoteProvider_)
                        SchemaError(kSchemaErrorRefNoRemoteProvider, source);
                    else {
                        if (const GenericSchemaDocument* remoteDocument = remoteProvider_->GetRemoteDocument(ref, spec_)) {
                            const Ch* s = ref.GetFragString();
                            len = ref.GetFragStringLength();
                            if (len <= 1 || s[1] == '/') {
                                // JSON pointer fragment, absolute in the remote schema
                                const PointerType pointer(s, len, allocator_);
                                if (!pointer.IsValid())
                                    SchemaErrorPointer(kSchemaErrorRefPointerInvalid, source, s, len, pointer);
                                else {
                                    // Get the subschema
                                    if (const SchemaType *sc = remoteDocument->GetSchema(pointer)) {
                                        if (schema)
                                            *schema = sc;
                                        AddSchemaRefs(const_cast<SchemaType *>(sc));
                                        return true;
                                    } else
                                        SchemaErrorValue(kSchemaErrorRefUnknown, source, ref.GetString(), ref.GetStringLength());
                                }
                            } else
                                // Plain name fragment, not allowed in remote schema
                                SchemaErrorValue(kSchemaErrorRefPlainName, source, s, len);
                        } else
                          SchemaErrorValue(kSchemaErrorRefNoRemoteSchema, source, ref.GetString(), ref.GetStringLength());
                    }
                }
                else { // Local reference
                    const Ch* s = ref.GetFragString();
                    len = ref.GetFragStringLength();
                    if (len <= 1 || s[1] == '/') {
                        // JSON pointer fragment, relative to the resolved URI
                        const PointerType relPointer(s, len, allocator_);
                        if (!relPointer.IsValid())
                            SchemaErrorPointer(kSchemaErrorRefPointerInvalid, source, s, len, relPointer);
                        else {
                            // Get the subschema
                            if (const ValueType *pv = relPointer.Get(*base)) {
                                // Now get the absolute JSON pointer by adding relative to base
                                PointerType pointer(basePointer, allocator_);
                                for (SizeType i = 0; i < relPointer.GetTokenCount(); i++)
                                    pointer = pointer.Append(relPointer.GetTokens()[i], allocator_);
                                if (IsCyclicRef(pointer))
                                    SchemaErrorValue(kSchemaErrorRefCyclical, source, ref.GetString(), ref.GetStringLength());
                                else {
                                    // Call CreateSchema recursively, but first compute the in-scope id for the $ref target as we have jumped there
                                    // TODO: cache pointer <-> id mapping
                                    size_t unresolvedTokenIndex;
                                    scopeId = pointer.GetUri(document, docId_, &unresolvedTokenIndex, allocator_);
                                    CreateSchema(schema, pointer, *pv, document, scopeId);
                                    return true;
                                }
                            } else
                                SchemaErrorValue(kSchemaErrorRefUnknown, source, ref.GetString(), ref.GetStringLength());
                        }
                    } else {
                        // Plain name fragment, relative to the resolved URI
                        // Not supported in open api 2.0 and 3.0
                        PointerType pointer(allocator_);
                        if (spec_.oapi == kVersion20 || spec_.oapi == kVersion30)
                            SchemaErrorValue(kSchemaErrorRefPlainName, source, s, len);
                        // See if the fragment matches an id in this document.
                        // Search from the base we just established. Returns the subschema in the document and its absolute JSON pointer.
                        else if (const ValueType *pv = FindId(*base, ref, pointer, UriType(ref.GetBaseString(), ref.GetBaseStringLength(), allocator_), true, basePointer)) {
                            if (IsCyclicRef(pointer))
                                SchemaErrorValue(kSchemaErrorRefCyclical, source, ref.GetString(), ref.GetStringLength());
                            else {
                                // Call CreateSchema recursively, but first compute the in-scope id for the $ref target as we have jumped there
                                // TODO: cache pointer <-> id mapping
                                size_t unresolvedTokenIndex;
                                scopeId = pointer.GetUri(document, docId_, &unresolvedTokenIndex, allocator_);
                                CreateSchema(schema, pointer, *pv, document, scopeId);
                                return true;
                            }
                        } else
                            SchemaErrorValue(kSchemaErrorRefUnknown, source, ref.GetString(), ref.GetStringLength());
                    }
                }
            }
        }

        // Invalid/Unknown $ref
        if (schema)
            *schema = typeless_;
        AddSchemaRefs(typeless_);
        return true;
    }